

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_initgamedialog.cpp
# Opt level: O2

void InitGameDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QArrayDataPointer<char16_t> local_38;
  QArrayDataPointer<char16_t> local_20;
  
  if (_c == IndexOfMethod) {
    if ((*_a[1] == sendPlayerNames) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if ((_c == InvokeMetaMethod) && (_id == 0)) {
    plVar1 = (long *)_a[1];
    local_20.d = (Data *)*plVar1;
    local_20.ptr = (char16_t *)plVar1[1];
    local_20.size = plVar1[2];
    if (local_20.d != (Data *)0x0) {
      LOCK();
      ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_20.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    plVar1 = (long *)_a[2];
    local_38.d = (Data *)*plVar1;
    local_38.ptr = (char16_t *)plVar1[1];
    local_38.size = plVar1[2];
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    sendPlayerNames((InitGameDialog *)_o,(QString *)&local_20,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_20);
  }
  return;
}

Assistant:

void InitGameDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<InitGameDialog *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->sendPlayerNames((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (InitGameDialog::*)(QString , QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&InitGameDialog::sendPlayerNames)) {
                *result = 0;
                return;
            }
        }
    }
}